

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.h
# Opt level: O0

string * aeron::Context::defaultAeronPath_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  getUserName_abi_cxx11_();
  std::operator+(in_RDI,"/dev/shm/aeron-",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

inline static std::string defaultAeronPath()
    {
#if defined(__linux__)
        return "/dev/shm/aeron-" + getUserName();
#elif (_MSC_VER)
        return tmpDir() + "/aeron-" + getUserName();
#else
        return tmpDir() + "/aeron-" + getUserName();
#endif
    }